

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsrtDebugManager.cpp
# Opt level: O1

ArenaAllocator * __thiscall JsrtDebugManager::GetDebugObjectArena(JsrtDebugManager *this)

{
  HeapAllocator *alloc;
  ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *this_00;
  undefined1 local_48 [8];
  TrackAllocData data;
  
  if (this->debugObjectArena == (ArenaAllocator *)0x0) {
    local_48 = (undefined1  [8])&Memory::ArenaAllocator::typeinfo;
    data.typeinfo = (type_info *)0x0;
    data.plusSize = 0xffffffffffffffff;
    data.count = (size_t)anon_var_dwarf_26fb6c;
    data.filename._0_4_ = 0x2b2;
    alloc = Memory::HeapAllocator::TrackAllocInfo
                      (&Memory::HeapAllocator::Instance,(TrackAllocData *)local_48);
    this_00 = (ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *)
              new<Memory::HeapAllocator>(0x80,alloc,0x300d4a);
    Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::ArenaAllocatorBase
              (this_00,L"DebugObjectArena",&(this->threadContext->pageAllocator).super_PageAllocator
               ,Js::Throw::OutOfMemory,JsUtil::ExternalApi::RecoverUnusedMemory);
    this->debugObjectArena = (ArenaAllocator *)this_00;
    DListBase<Memory::ArenaData*,RealCount>::
    PrependNode<Memory::NoThrowHeapAllocator,Memory::ArenaData*>
              ((DListBase<Memory::ArenaData*,RealCount> *)
               &this->threadContext->recycler->externalGuestArenaList,
               (NoThrowHeapAllocator *)&Memory::NoThrowHeapAllocator::Instance,
               &this_00->super_ArenaData);
  }
  return this->debugObjectArena;
}

Assistant:

ArenaAllocator* JsrtDebugManager::GetDebugObjectArena()
{
    if (this->debugObjectArena == nullptr)
    {
        this->debugObjectArena = HeapNew(ArenaAllocator, _u("DebugObjectArena"), this->threadContext->GetPageAllocator(), Js::Throw::OutOfMemory);

        this->threadContext->GetRecycler()->RegisterExternalGuestArena(this->debugObjectArena);
    }

    return this->debugObjectArena;
}